

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bad_alloc *anon_var_0;
  string local_98 [39];
  allocator local_71;
  string local_70 [52];
  int local_3c;
  string local_38 [4];
  int opt;
  string subfolder;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  std::__cxx11::string::string(local_38);
  while( true ) {
    local_3c = getopt(argc,argv,"K:vh");
    if (local_3c == -1) {
      lVar1 = std::__cxx11::string::length();
      if (lVar1 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"",&local_71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"",(allocator *)((long)&anon_var_0 + 7));
        initstreams((string *)local_70,(string *)local_98);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        summaryindex::doit((string *)local_38);
        std::__cxx11::string::~string(local_38);
        return 0;
      }
      fprintf(_stderr,"FATAL: No folder supplied for summarycalc files\n");
      exit(1);
    }
    if (local_3c != 0x4b) break;
    std::__cxx11::string::operator=(local_38,_optarg);
  }
  if ((local_3c != 0x68) && (local_3c == 0x76)) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
    exit(1);
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	while ((opt = getopt(argc, argv, (char *)"K:vh")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	initstreams();
	try {
		summaryindex::doit(subfolder);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}